

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O1

TPZCompEl * __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeLinear>_>::Clone
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeLinear>_> *this,TPZCompMesh *mesh)

{
  TPZCompElH1<pzshape::TPZShapeLinear> *this_00;
  
  this_00 = (TPZCompElH1<pzshape::TPZShapeLinear> *)operator_new(0x90);
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0199cfa0;
  TPZCompElH1<pzshape::TPZShapeLinear>::TPZCompElH1
            (this_00,&PTR_PTR_01998890,mesh,&this->super_TPZCompElH1<pzshape::TPZShapeLinear>);
  *(undefined8 *)
   &this_00[1].super_TPZIntelGen<pzshape::TPZShapeLinear>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = 0;
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_019984c0;
  return (TPZCompEl *)this_00;
}

Assistant:

inline TPZCompEl * TPZCompElPostProc<TCOMPEL>::Clone(TPZCompMesh &mesh) const{
    return new TPZCompElPostProc<TCOMPEL> (mesh, *this);
}